

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O0

boolean pmatch(char *patrn,char *strng)

{
  char cVar1;
  char cVar2;
  boolean bVar3;
  char *strng_00;
  char *patrn_00;
  char p;
  char *pcStack_20;
  char s;
  char *strng_local;
  char *patrn_local;
  
  pcStack_20 = strng;
  strng_local = patrn;
  while( true ) {
    strng_00 = pcStack_20 + 1;
    cVar1 = *pcStack_20;
    patrn_00 = strng_local + 1;
    cVar2 = *strng_local;
    if (cVar2 == '\0') {
      return cVar1 == '\0';
    }
    if (cVar2 == '*') break;
    pcStack_20 = strng_00;
    strng_local = patrn_00;
    if ((cVar2 != cVar1) && ((cVar2 != '?' || (cVar1 == '\0')))) {
      return '\0';
    }
  }
  if ((*patrn_00 != '\0') && (bVar3 = pmatch(patrn_00,pcStack_20), bVar3 == '\0')) {
    if (cVar1 != '\0') {
      bVar3 = pmatch(strng_local,strng_00);
      return bVar3;
    }
    return '\0';
  }
  return '\x01';
}

Assistant:

boolean pmatch(const char *patrn, const char *strng)
{
    char s, p;
  /*
   :  Simple pattern matcher:  '*' matches 0 or more characters, '?' matches
   :  any single character.  Returns TRUE if 'strng' matches 'patrn'.
   */
pmatch_top:
    s = *strng++;  p = *patrn++;	/* get next chars and pre-advance */
    if (!p)			/* end of pattern */
	return (boolean)(s == '\0');		/* matches iff end of string too */
    else if (p == '*')		/* wildcard reached */
	return((boolean)((!*patrn || pmatch(patrn, strng-1)) ? TRUE :
		s ? pmatch(patrn-1, strng) : FALSE));
    else if (p != s && (p != '?' || !s))  /* check single character */
	return FALSE;		/* doesn't match */
    else				/* return pmatch(patrn, strng); */
	goto pmatch_top;	/* optimize tail recursion */
}